

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall
double_conversion::Bignum::AssignDecimalString(Bignum *this,Vector<const_char> value)

{
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  int iVar1;
  Bignum *in_RDI;
  long in_FS_OFFSET;
  uint64_t digits;
  uint64_t digits_1;
  uint pos;
  int length;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa8;
  int from;
  uint64_t in_stack_ffffffffffffffb0;
  int iVar2;
  Vector<const_char> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Zero(in_RDI);
  iVar1 = Vector<const_char>::length(&local_18);
  iVar2 = 0;
  while (from = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20), 0x12 < iVar1) {
    buffer.length_ = iVar2;
    buffer.start_ = (char *)in_stack_ffffffffffffffb0;
    buffer._12_4_ = iVar1;
    in_stack_ffffffffffffffb0 = ReadUInt64(buffer,from,(int)in_stack_ffffffffffffffa8);
    iVar2 = iVar2 + 0x13;
    iVar1 = iVar1 + -0x13;
    MultiplyByPowerOfTen(in_RDI,in_stack_ffffffffffffff9c);
    AddUInt64(in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  buffer_00.length_ = iVar2;
  buffer_00.start_ = (char *)in_stack_ffffffffffffffb0;
  buffer_00._12_4_ = iVar1;
  ReadUInt64(buffer_00,from,(int)in_stack_ffffffffffffffa8);
  MultiplyByPowerOfTen(in_RDI,in_stack_ffffffffffffff9c);
  AddUInt64(in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  Clamp(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Bignum::AssignDecimalString(const Vector<const char> value) {
  // 2^64 = 18446744073709551616 > 10^19
  static const int kMaxUint64DecimalDigits = 19;
  Zero();
  int length = value.length();
  unsigned pos = 0;
  // Let's just say that each digit needs 4 bits.
  while (length >= kMaxUint64DecimalDigits) {
    const uint64_t digits = ReadUInt64(value, pos, kMaxUint64DecimalDigits);
    pos += kMaxUint64DecimalDigits;
    length -= kMaxUint64DecimalDigits;
    MultiplyByPowerOfTen(kMaxUint64DecimalDigits);
    AddUInt64(digits);
  }
  const uint64_t digits = ReadUInt64(value, pos, length);
  MultiplyByPowerOfTen(length);
  AddUInt64(digits);
  Clamp();
}